

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O3

void ** ialloc(mstate m,size_t n_elements,size_t *sizes,int opts,void **chunks)

{
  uint uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  void *__s;
  long lVar5;
  void **ppvVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  if (chunks == (void **)0x0) {
    if (n_elements == 0) {
      ppvVar6 = (void **)mspace_malloc(m,0);
      return ppvVar6;
    }
    uVar10 = 0x20;
    if (0x16 < n_elements * 8) {
      uVar10 = n_elements * 8 + 0x17 & 0xfffffffffffffff0;
    }
  }
  else {
    if (n_elements == 0) {
      return chunks;
    }
    uVar10 = 0;
  }
  if ((opts & 1U) == 0) {
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar15 = vpbroadcastq_avx512f(ZEXT816(0x17));
    auVar16 = vpbroadcastq_avx512f(ZEXT816(0x20));
    auVar17 = vpbroadcastq_avx512f(ZEXT816(0xfffffffffffffff0));
    auVar23 = ZEXT1664((undefined1  [16])0x0);
    auVar18 = vpbroadcastq_avx512f();
    uVar7 = 0;
    do {
      auVar19 = vpbroadcastq_avx512f();
      auVar20 = vmovdqa64_avx512f(auVar23);
      auVar23 = vporq_avx512f(auVar19,auVar14);
      auVar19 = vmovdqa64_avx512f(auVar16);
      uVar9 = vpcmpuq_avx512f(auVar23,auVar18,2);
      auVar23 = vmovdqu64_avx512f(*(undefined1 (*) [64])(sizes + uVar7));
      auVar21._8_8_ = (ulong)((byte)(uVar9 >> 1) & 1) * auVar23._8_8_;
      auVar21._0_8_ = (ulong)((byte)uVar9 & 1) * auVar23._0_8_;
      auVar21._16_8_ = (ulong)((byte)(uVar9 >> 2) & 1) * auVar23._16_8_;
      auVar21._24_8_ = (ulong)((byte)(uVar9 >> 3) & 1) * auVar23._24_8_;
      auVar21._32_8_ = (ulong)((byte)(uVar9 >> 4) & 1) * auVar23._32_8_;
      auVar21._40_8_ = (ulong)((byte)(uVar9 >> 5) & 1) * auVar23._40_8_;
      auVar21._48_8_ = (ulong)((byte)(uVar9 >> 6) & 1) * auVar23._48_8_;
      auVar21._56_8_ = (uVar9 >> 7) * auVar23._56_8_;
      uVar7 = uVar7 + 8;
      uVar8 = vpcmpuq_avx512f(auVar21,auVar15,5);
      auVar23 = vpaddq_avx512f(auVar21,auVar15);
      auVar23 = vpandq_avx512f(auVar23,auVar17);
      bVar2 = (bool)((byte)uVar8 & 1);
      auVar22._0_8_ = (ulong)bVar2 * auVar23._0_8_ | (ulong)!bVar2 * auVar19._0_8_;
      bVar2 = (bool)((byte)(uVar8 >> 1) & 1);
      auVar22._8_8_ = (ulong)bVar2 * auVar23._8_8_ | (ulong)!bVar2 * auVar19._8_8_;
      bVar2 = (bool)((byte)(uVar8 >> 2) & 1);
      auVar22._16_8_ = (ulong)bVar2 * auVar23._16_8_ | (ulong)!bVar2 * auVar19._16_8_;
      bVar2 = (bool)((byte)(uVar8 >> 3) & 1);
      auVar22._24_8_ = (ulong)bVar2 * auVar23._24_8_ | (ulong)!bVar2 * auVar19._24_8_;
      bVar2 = (bool)((byte)(uVar8 >> 4) & 1);
      auVar22._32_8_ = (ulong)bVar2 * auVar23._32_8_ | (ulong)!bVar2 * auVar19._32_8_;
      bVar2 = (bool)((byte)(uVar8 >> 5) & 1);
      auVar22._40_8_ = (ulong)bVar2 * auVar23._40_8_ | (ulong)!bVar2 * auVar19._40_8_;
      bVar2 = (bool)((byte)(uVar8 >> 6) & 1);
      auVar22._48_8_ = (ulong)bVar2 * auVar23._48_8_ | (ulong)!bVar2 * auVar19._48_8_;
      auVar22._56_8_ = (uVar8 >> 7) * auVar23._56_8_ | (ulong)!SUB81(uVar8 >> 7,0) * auVar19._56_8_;
      auVar23 = vpaddq_avx512f(auVar22,auVar20);
    } while ((n_elements + 7 & 0xfffffffffffffff8) != uVar7);
    auVar14 = vmovdqa64_avx512f(auVar23);
    bVar2 = (bool)((byte)uVar9 & 1);
    auVar15._0_8_ = (ulong)bVar2 * auVar14._0_8_ | (ulong)!bVar2 * auVar20._0_8_;
    bVar2 = (bool)((byte)(uVar9 >> 1) & 1);
    auVar15._8_8_ = (ulong)bVar2 * auVar14._8_8_ | (ulong)!bVar2 * auVar20._8_8_;
    bVar2 = (bool)((byte)(uVar9 >> 2) & 1);
    auVar15._16_8_ = (ulong)bVar2 * auVar14._16_8_ | (ulong)!bVar2 * auVar20._16_8_;
    bVar2 = (bool)((byte)(uVar9 >> 3) & 1);
    auVar15._24_8_ = (ulong)bVar2 * auVar14._24_8_ | (ulong)!bVar2 * auVar20._24_8_;
    bVar2 = (bool)((byte)(uVar9 >> 4) & 1);
    auVar15._32_8_ = (ulong)bVar2 * auVar14._32_8_ | (ulong)!bVar2 * auVar20._32_8_;
    bVar2 = (bool)((byte)(uVar9 >> 5) & 1);
    auVar15._40_8_ = (ulong)bVar2 * auVar14._40_8_ | (ulong)!bVar2 * auVar20._40_8_;
    bVar2 = (bool)((byte)(uVar9 >> 6) & 1);
    auVar15._48_8_ = (ulong)bVar2 * auVar14._48_8_ | (ulong)!bVar2 * auVar20._48_8_;
    auVar15._56_8_ = (uVar9 >> 7) * auVar14._56_8_ | (ulong)!SUB81(uVar9 >> 7,0) * auVar20._56_8_;
    auVar13 = vextracti64x4_avx512f(auVar15,1);
    uVar7 = 0;
    auVar14 = vpaddq_avx512f(auVar15,ZEXT3264(auVar13));
    auVar3 = vpaddq_avx(auVar14._0_16_,auVar14._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpaddq_avx(auVar3,auVar4);
    uVar9 = auVar3._0_8_;
  }
  else {
    uVar7 = 0x20;
    if (0x16 < *sizes) {
      uVar7 = *sizes + 0x17 & 0xfffffffffffffff0;
    }
    uVar9 = uVar7 * n_elements;
  }
  uVar1 = m->mflags;
  m->mflags = uVar1 & 0xfffffffe;
  __s = mspace_malloc(m,(uVar10 - 8) + uVar9);
  if ((uVar1 & 1) != 0) {
    *(byte *)&m->mflags = (byte)m->mflags | 1;
  }
  if (__s == (void *)0x0) {
    chunks = (void **)0x0;
  }
  else {
    uVar8 = *(ulong *)((long)__s + -8) & 0xfffffffffffffff8;
    if ((opts & 2U) != 0) {
      memset(__s,0,(uVar8 - uVar10) - 8);
    }
    lVar11 = (long)__s + -0x10;
    if (chunks == (void **)0x0) {
      chunks = (void **)((long)__s + uVar9);
      chunks[-1] = (void *)(uVar8 - uVar9 | 3);
      uVar8 = uVar9;
    }
    *chunks = __s;
    if (n_elements != 1) {
      lVar5 = 0;
      lVar12 = lVar11;
      do {
        uVar10 = uVar7;
        if ((uVar7 == 0) && (uVar10 = sizes[lVar5] + 0x17 & 0xfffffffffffffff0, sizes[lVar5] < 0x17)
           ) {
          uVar10 = 0x20;
        }
        uVar8 = uVar8 - uVar10;
        *(ulong *)(lVar12 + 8) = uVar10 | 3;
        lVar11 = lVar12 + uVar10;
        chunks[lVar5 + 1] = (void *)(lVar12 + 0x10 + uVar10);
        lVar5 = lVar5 + 1;
        lVar12 = lVar11;
      } while (n_elements - 1 != lVar5);
    }
    *(ulong *)(lVar11 + 8) = uVar8 | 3;
  }
  return chunks;
}

Assistant:

static void** ialloc(mstate m,
                     size_t n_elements,
                     size_t* sizes,
                     int opts,
                     void* chunks[]) {

  size_t    element_size;   /* chunksize of each element, if all same */
  size_t    contents_size;  /* total size of elements */
  size_t    array_size;     /* request size of pointer array */
  void*     mem;            /* malloced aggregate space */
  mchunkptr p;              /* corresponding chunk */
  size_t    remainder_size; /* remaining bytes while splitting */
  void**    marray;         /* either "chunks" or malloced ptr array */
  mchunkptr array_chunk;    /* chunk for malloced ptr array */
  flag_t    was_enabled;    /* to disable mmap */
  size_t    size;
  size_t    i;

  ensure_initialization();
  /* compute array length, if needed */
  if (chunks != 0) {
    if (n_elements == 0)
      return chunks; /* nothing to do */
    marray = chunks;
    array_size = 0;
  }
  else {
    /* if empty req, must still return chunk representing empty array */
    if (n_elements == 0)
      return (void**)internal_malloc(m, 0);
    marray = 0;
    array_size = request2size(n_elements * (sizeof(void*)));
  }

  /* compute total element size */
  if (opts & 0x1) { /* all-same-size */
    element_size = request2size(*sizes);
    contents_size = n_elements * element_size;
  }
  else { /* add up all the sizes */
    element_size = 0;
    contents_size = 0;
    for (i = 0; i != n_elements; ++i)
      contents_size += request2size(sizes[i]);
  }

  size = contents_size + array_size;

  /*
     Allocate the aggregate chunk.  First disable direct-mmapping so
     malloc won't use it, since we would not be able to later
     free/realloc space internal to a segregated mmap region.
  */
  was_enabled = use_mmap(m);
  disable_mmap(m);
  mem = internal_malloc(m, size - CHUNK_OVERHEAD);
  if (was_enabled)
    enable_mmap(m);
  if (mem == 0)
    return 0;

  if (PREACTION(m)) return 0;
  p = mem2chunk(mem);
  remainder_size = chunksize(p);

  assert(!is_mmapped(p));

  if (opts & 0x2) {       /* optionally clear the elements */
    memset((size_t*)mem, 0, remainder_size - SIZE_T_SIZE - array_size);
  }

  /* If not provided, allocate the pointer array as final part of chunk */
  if (marray == 0) {
    size_t  array_chunk_size;
    array_chunk = chunk_plus_offset(p, contents_size);
    array_chunk_size = remainder_size - contents_size;
    marray = (void**) (chunk2mem(array_chunk));
    set_size_and_pinuse_of_inuse_chunk(m, array_chunk, array_chunk_size);
    remainder_size = contents_size;
  }

  /* split out elements */
  for (i = 0; ; ++i) {
    marray[i] = chunk2mem(p);
    if (i != n_elements-1) {
      if (element_size != 0)
        size = element_size;
      else
        size = request2size(sizes[i]);
      remainder_size -= size;
      set_size_and_pinuse_of_inuse_chunk(m, p, size);
      p = chunk_plus_offset(p, size);
    }
    else { /* the final element absorbs any overallocation slop */
      set_size_and_pinuse_of_inuse_chunk(m, p, remainder_size);
      break;
    }
  }

#if DEBUG
  if (marray != chunks) {
    /* final element must have exactly exhausted chunk */
    if (element_size != 0) {
      assert(remainder_size == element_size);
    }
    else {
      assert(remainder_size == request2size(sizes[i]));
    }
    check_inuse_chunk(m, mem2chunk(marray));
  }
  for (i = 0; i != n_elements; ++i)
    check_inuse_chunk(m, mem2chunk(marray[i]));

#endif /* DEBUG */

  POSTACTION(m);
  return marray;
}